

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O0

void __thiscall
ComponentImport_basics_Test::~ComponentImport_basics_Test(ComponentImport_basics_Test *this)

{
  ComponentImport_basics_Test *this_local;
  
  ~ComponentImport_basics_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ComponentImport, basics)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"a-model.xml\">\n"
        "    <component component_ref=\"bob\" name=\"\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("a-model.xml");

    libcellml::ComponentPtr c = libcellml::Component::create();
    EXPECT_EQ(nullptr, c->importSource());
    EXPECT_EQ("", c->importReference());

    c->setImportSource(imp);
    c->setImportReference("bob");

    EXPECT_EQ(imp, c->importSource());
    EXPECT_EQ("bob", c->importReference());

    m->addComponent(c);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);

    EXPECT_EQ(e, a);
}